

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void init_step(void)

{
  Person *this;
  Admin *person;
  
  this = (Person *)operator_new(0x60);
  Person::Person(this,true,"Admin","Admin",0x14);
  person = (Admin *)operator_new(0x60);
  Admin::Admin(person,this,"toor");
  Admin::addNewPerson(person,(Person *)person);
  return;
}

Assistant:

void init_step(){
    char *name = (char*)"Admin";
    char* surname = (char*)"Admin";
    char* pass1 = (char*)"toor";
    Person* first_person = new Person(true,name,surname,20);
    Admin* first_admin = new Admin(first_person,pass1);
    first_admin->addNewPerson(first_admin);

}